

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Word.cpp
# Opt level: O0

void __thiscall DragonParser::LexerNamespace::Word::~Word(Word *this)

{
  Word *this_local;
  
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Word_00110b08;
  Token::~Token(&this->super_Token);
  std::__cxx11::string::clear();
  std::__cxx11::string::~string((string *)&this->lexme);
  Token::~Token(&this->super_Token);
  return;
}

Assistant:

Word::~Word()
    {
        Token::~Token();
        lexme.clear();
    }